

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restrict.hpp
# Opt level: O0

ssize_t __thiscall
stream::
restricted_source<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>
::read(restricted_source<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,int __fd,void *__buf,size_t __nbytes)

{
  unsigned_long *puVar1;
  undefined4 in_register_00000034;
  streamsize nread;
  type *in_stack_ffffffffffffffb8;
  unsigned_long local_38;
  unsigned_long local_30;
  void *local_28;
  void *local_20;
  undefined8 local_18;
  restricted_source<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  unsigned_long local_8;
  
  local_18 = CONCAT44(in_register_00000034,__fd);
  if ((long)__buf < 1) {
    local_8 = 0;
  }
  else {
    local_28 = __buf;
    local_20 = __buf;
    local_10 = this;
    puVar1 = std::min<unsigned_long>((unsigned_long *)&local_28,&this->remaining);
    local_20 = (void *)*puVar1;
    if (local_20 == (void *)0x0) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      local_38 = boost::iostreams::
                 read<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>>
                           ((chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>
                             *)this,in_stack_ffffffffffffffb8,0x1b4e12);
      local_30 = local_38;
      if (0 < (long)local_38) {
        puVar1 = std::min<unsigned_long>(&local_38,&this->remaining);
        this->remaining = this->remaining - *puVar1;
      }
      local_8 = local_30;
    }
  }
  return local_8;
}

Assistant:

std::streamsize read(char * buffer, std::streamsize bytes) {
		
		if(bytes <= 0) {
			return 0;
		}
		
		// Restrict the number of bytes to read
		bytes = std::streamsize(std::min(boost::uint64_t(bytes), remaining));
		if(bytes == 0) {
			return -1; // End of the restricted source reached
		}
		
		std::streamsize nread = boost::iostreams::read(base, buffer, bytes);
		
		// Remember how many bytes were read so far
		if(nread > 0) {
			remaining -= std::min(boost::uint64_t(nread), remaining);
		}
		
		return nread;
	}